

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O2

void test_2d_static<30ul,30ul>(void)

{
  long lVar1;
  _Head_base<0UL,_int,_false> *t;
  _Head_base<1UL,_int,_false> local_1c78;
  _Head_base<0UL,_int,_false> local_1c74;
  value_type true_idx;
  tuple<int,_int> *local_1c68;
  tuple<int,_int> *local_1c60;
  tuple<int,_int> dptr [900];
  
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x5f,"void test_2d_static() [X = 30UL, Y = 30UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int> =
       dptr[0].super__Tuple_impl<0UL,_int,_int> & 0xffffffffffffff00;
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x61,"void test_2d_static() [X = 30UL, Y = 30UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int> =
       dptr[0].super__Tuple_impl<0UL,_int,_int> & 0xffffffffffffff00;
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x62,"void test_2d_static() [X = 30UL, Y = 30UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)0x1;
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,100,"void test_2d_static() [X = 30UL, Y = 30UL]",(unsigned_long *)dptr,
             (int *)&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)0x1e;
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x65,"void test_2d_static() [X = 30UL, Y = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)0x384;
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x67,"void test_2d_static() [X = 30UL, Y = 30UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)0x384;
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x68,"void test_2d_static() [X = 30UL, Y = 30UL]",(unsigned_long *)dptr,&true_idx);
  memset(dptr,0,0x1c20);
  for (local_1c78._M_head_impl = 0; (uint)local_1c78._M_head_impl < 0x1e;
      local_1c78._M_head_impl = local_1c78._M_head_impl + 1) {
    for (local_1c74._M_head_impl = 0; (uint)local_1c74._M_head_impl < 0x1e;
        local_1c74._M_head_impl = local_1c74._M_head_impl + 1) {
      true_idx = (long)local_1c78._M_head_impl * 0x1e + (ulong)(uint)local_1c74._M_head_impl;
      local_1c68 = (tuple<int,_int> *)true_idx;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x72,"void test_2d_static() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_1c68,
                 &true_idx);
      local_1c68 = dptr + (long)local_1c78._M_head_impl * 0x1e + (long)local_1c74._M_head_impl;
      local_1c60 = dptr + true_idx;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x74,"void test_2d_static() [X = 30UL, Y = 30UL]",&local_1c68,&local_1c60);
      lVar1 = (long)local_1c78._M_head_impl * 0x1e + (long)local_1c74._M_head_impl;
      t = &dptr[lVar1].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
      t->_M_head_impl = local_1c74._M_head_impl;
      dptr[lVar1].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = local_1c78._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x79,"void test_2d_static() [X = 30UL, Y = 30UL]",&t->_M_head_impl,
                 &local_1c74._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x7a,"void test_2d_static() [X = 30UL, Y = 30UL]",
                 (int *)(dptr + (long)local_1c78._M_head_impl * 0x1e + (long)local_1c74._M_head_impl
                        ),&local_1c78._M_head_impl);
    }
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    tuple<int, int> dptr[X * Y];

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 
    }
}